

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerSafe::EnergyScan
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint32_t aChannelMask,uint8_t aCount
          ,uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  undefined7 in_register_00000009;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> local_80;
  promise<ot::commissioner::Error> local_70;
  promise<ot::commissioner::Error> *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  std::promise<ot::commissioner::Error>::promise(&local_70);
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:519:32)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:519:32)>
             ::_M_manager;
  local_58 = &local_70;
  (*(this->super_Commissioner)._vptr_Commissioner[0x2f])
            (this,&local_58,(ulong)aChannelMask,CONCAT71(in_register_00000009,aCount) & 0xffffffff,
             CONCAT62(in_register_00000082,aPeriod) & 0xffffffff,
             CONCAT62(in_register_0000008a,aScanDuration) & 0xffffffff,aDstAddr);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&local_80,&local_70._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_80);
  if (local_80._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::EnergyScan(uint32_t           aChannelMask,
                                   uint8_t            aCount,
                                   uint16_t           aPeriod,
                                   uint16_t           aScanDuration,
                                   const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };

    EnergyScan(wait, aChannelMask, aCount, aPeriod, aScanDuration, aDstAddr);
    return pro.get_future().get();
}